

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall
google::protobuf::EnumValueDescriptorProto::EnumValueDescriptorProto
          (EnumValueDescriptorProto *this,EnumValueDescriptorProto *from)

{
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__EnumValueDescriptorProto_0028fe10;
  UnknownFieldSet::UnknownFieldSet(&this->_unknown_fields_);
  this->_cached_size_ = 0;
  this->_has_bits_[0] = 0;
  this->name_ = (string *)internal::kEmptyString_abi_cxx11_;
  this->number_ = 0;
  this->options_ = (EnumValueOptions *)0x0;
  MergeFrom(this,from);
  return;
}

Assistant:

EnumValueDescriptorProto::EnumValueDescriptorProto(const EnumValueDescriptorProto& from)
  : ::google::protobuf::Message() {
  SharedCtor();
  MergeFrom(from);
}